

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp2_fast_moreThen5(word *pInOut,int iVar,int iQ,int jQ,int nWords,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  bVar1 = (byte)(iVar + -6);
  if (nWords < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    uVar4 = 1 << (bVar1 & 0x1f);
    iVar3 = nWords + -1;
    if ((int)uVar4 < 2) {
      uVar4 = 1;
    }
    do {
      if (iVar + -6 != 0x1f) {
        lVar5 = 0;
        do {
          iVar2 = -(uint)(pInOut[(iVar3 + lVar5) - (long)(iQ << (bVar1 & 0x1f))] <
                         pInOut[(iVar3 + lVar5) - (long)(jQ << (bVar1 & 0x1f))]);
          if (pInOut[(iVar3 + lVar5) - (long)(jQ << (bVar1 & 0x1f))] <
              pInOut[(iVar3 + lVar5) - (long)(iQ << (bVar1 & 0x1f))]) {
            iVar2 = 1;
          }
          if (iVar2 != 0) {
            iVar3 = iVar3 + 1;
            if (iVar2 == -1) goto LAB_00562199;
            iVar2 = 1;
            goto LAB_005621b1;
          }
          lVar5 = lVar5 + -1;
        } while (-lVar5 != (ulong)uVar4);
      }
      iVar3 = iVar3 + (-4 << (bVar1 & 0x1f));
    } while (-1 < iVar3);
    iVar3 = 0;
LAB_00562199:
    iVar2 = 0;
  }
LAB_005621b1:
  *pDifStart = iVar3;
  return iVar2;
}

Assistant:

int minTemp2_fast_moreThen5(word* pInOut, int iVar, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp2_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j-iQ*wordBlock],pInOut[i-j-jQ*wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 1;
            }
        }
    *pDifStart=0;
//    printf("out minTemp2_fast_moreThen5\n");
    
    return 0;
}